

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

FSectorPortal * __thiscall sector_t::ValidatePortal(sector_t *this,int which)

{
  bool bVar1;
  bool local_39;
  FTextureID local_2c;
  sector_t *local_28;
  FSectorPortal *port;
  sector_t *psStack_18;
  int which_local;
  sector_t *this_local;
  
  port._4_4_ = which;
  psStack_18 = this;
  local_28 = (sector_t *)GetPortal(this,which);
  if ((*(int *)&local_28->planes[0].xform.xOffs == 0) &&
     (bVar1 = TObjPtr<AActor>::operator==
                        ((TObjPtr<AActor> *)&local_28->planes[0].Flags,(AActor *)0x0), bVar1)) {
    this_local = (sector_t *)0x0;
  }
  else {
    bVar1 = PortalBlocksView(this,port._4_4_);
    if (bVar1) {
      this_local = (sector_t *)0x0;
    }
    else {
      local_39 = false;
      if (((ulong)local_28->planes[0].xform.xOffs & 0x100000000) != 0) {
        local_2c = GetTexture(this,port._4_4_);
        local_39 = FTextureID::operator!=(&local_2c,&skyflatnum);
      }
      if (local_39 == false) {
        this_local = local_28;
      }
      else {
        this_local = (sector_t *)0x0;
      }
    }
  }
  return (FSectorPortal *)this_local;
}

Assistant:

FSectorPortal *sector_t::ValidatePortal(int which)
{
	FSectorPortal *port = GetPortal(which);
	if (port->mType == PORTS_SKYVIEWPOINT && port->mSkybox == nullptr) return nullptr;				// A skybox without a viewpoint is just a regular sky.
	if (PortalBlocksView(which)) return nullptr;													// disabled or obstructed linked portal.
	if ((port->mFlags & PORTSF_SKYFLATONLY) && GetTexture(which) != skyflatnum) return nullptr;		// Skybox without skyflat texture
	return port;
}